

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

CBlockIndex * __thiscall CChain::FindEarliestAtLeast(CChain *this,int64_t nTime,int height)

{
  pointer ppCVar1;
  ulong uVar2;
  pointer ppCVar3;
  CBlockIndex *pCVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  ppCVar3 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  uVar5 = (long)ppCVar1 - (long)ppCVar3 >> 3;
  while (uVar2 = uVar5, 0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    if (((long)(ulong)ppCVar3[uVar5]->nTimeMax < nTime) || (ppCVar3[uVar5]->nHeight < height)) {
      ppCVar3 = ppCVar3 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if (ppCVar3 == ppCVar1) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pCVar4 = *ppCVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return pCVar4;
}

Assistant:

CBlockIndex* CChain::FindEarliestAtLeast(int64_t nTime, int height) const
{
    std::pair<int64_t, int> blockparams = std::make_pair(nTime, height);
    std::vector<CBlockIndex*>::const_iterator lower = std::lower_bound(vChain.begin(), vChain.end(), blockparams,
        [](CBlockIndex* pBlock, const std::pair<int64_t, int>& blockparams) -> bool { return pBlock->GetBlockTimeMax() < blockparams.first || pBlock->nHeight < blockparams.second; });
    return (lower == vChain.end() ? nullptr : *lower);
}